

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void __thiscall
gl4cts::GLSL420Pack::BindingSamplerArrayTest::prepareUniforms
          (BindingSamplerArrayTest *this,program *program)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  uint uVar2;
  BindingSamplerArrayTest *this_00;
  long lVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_data;
  texture *textures [7];
  
  textures[0] = &this->m_goku_00_texture;
  textures[1] = &this->m_goku_01_texture;
  textures[2] = &this->m_goku_02_texture;
  textures[3] = &this->m_goku_03_texture;
  textures[4] = &this->m_goku_04_texture;
  textures[5] = &this->m_goku_05_texture;
  textures[6] = &this->m_goku_06_texture;
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&texture_data,0x100);
  this_00 = (BindingSamplerArrayTest *)
            ((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx;
  iVar1 = (*(this_00->super_GLSLTestBase).super_TestBase.super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[3])();
  lVar3 = 0;
  while (lVar3 != 7) {
    checkBinding(this_00,program,(GLuint)lVar3,(GLint)(lVar3 + 1));
    (**(code **)(CONCAT44(extraout_var,iVar1) + 8))((GLuint)lVar3 + 0x84c1);
    err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    glu::checkError(err,"ActiveTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x2a24);
    this_00 = (BindingSamplerArrayTest *)textures[lVar3];
    Utils::texture::create((texture *)this_00,0x10,0x10,0x8058);
    for (uVar2 = 0;
        (ulong)uVar2 <
        (ulong)((long)texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
      texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar2] = prepareUniforms::goku_data[lVar3];
    }
    Utils::texture::update
              ((texture *)this_00,0x10,0x10,0,0x1908,0x1401,
               texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    lVar3 = lVar3 + 1;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void BindingSamplerArrayTest::prepareUniforms(Utils::program& program)
{
	static const GLuint goku_data[7] = {
		0x00000000, 0xff000000, 0x00ff0000, 0xffff0000, 0x0000ff00, 0xff00ff00, 0x00ffff00,
	};

	static const GLuint binding_offset = 1;

	Utils::texture* textures[7] = {
		&m_goku_00_texture, &m_goku_01_texture, &m_goku_02_texture, &m_goku_03_texture,
		&m_goku_04_texture, &m_goku_05_texture, &m_goku_06_texture,
	};

	std::vector<GLuint> texture_data;
	texture_data.resize(16 * 16);

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (GLuint i = 0; i < 7; ++i)
	{
		GLint expected_binding = i + binding_offset;

		checkBinding(program, i, expected_binding);

		gl.activeTexture(GL_TEXTURE0 + expected_binding);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");

		textures[i]->create(16, 16, GL_RGBA8);

		for (GLuint j = 0; j < texture_data.size(); ++j)
		{
			texture_data[j] = goku_data[i];
		}

		textures[i]->update(16, 16, 0 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, &texture_data[0]);
	}
}